

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceVkImpl.cpp
# Opt level: O3

void __thiscall
Diligent::RenderDeviceVkImpl::AllocateTransientCmdPool
          (RenderDeviceVkImpl *this,SoftwareQueueIndex CommandQueueId,CommandPoolWrapper *CmdPool,
          VulkanCommandBuffer *CmdBuffer,Char *DebugPoolName)

{
  VkPipelineStageFlags VVar1;
  VkAccessFlags VVar2;
  element_type *peVar3;
  VkResult VVar4;
  ICommandQueueVk *pIVar5;
  iterator iVar6;
  VkCommandBuffer pVVar7;
  char (*Args_2) [2];
  HardwareQueueIndex QueueFamilyIndex;
  string msg;
  string msg_1;
  string msg_2;
  key_type local_99;
  undefined1 local_98 [32];
  _Alloc_hider local_78;
  void *pvStack_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  string local_50;
  
  Args_2 = (char (*) [2])DebugPoolName;
  pIVar5 = RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
           ::GetCommandQueue(&this->
                              super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                             ,CommandQueueId);
  local_98._0_4_ = (*(pIVar5->super_ICommandQueue).super_IObject._vptr_IObject[0xc])(pIVar5);
  local_99.m_Value = StaticCast<unsigned_char,unsigned_int>((uint *)local_98);
  iVar6 = std::
          _Hashtable<Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>,_std::allocator<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>_>,_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->m_TransientCmdPoolMgrs)._M_h,&local_99);
  if (iVar6.
      super__Node_iterator_base<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>,_false>
      ._M_cur == (__node_type *)0x0) {
    local_78._M_p._0_4_ = (uint)local_99.m_Value;
    FormatString<char[69],unsigned_int,char[2]>
              ((string *)local_98,
               (Diligent *)"Con not find transient command pool manager for queue family index (",
               (char (*) [69])&local_78,(uint *)0x73bf31,Args_2);
    DebugAssertionFailed
              ((Char *)local_98._0_8_,"AllocateTransientCmdPool",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderDeviceVkImpl.cpp"
               ,0x102);
    if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
      operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
    }
  }
  CommandPoolManager::AllocateCommandPool
            ((CommandPoolWrapper *)local_98,
             (CommandPoolManager *)
             ((long)iVar6.
                    super__Node_iterator_base<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>,_false>
                    ._M_cur + 0x10),DebugPoolName);
  VulkanUtilities::VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>::
  operator=(CmdPool,(CommandPoolWrapper *)local_98);
  VulkanUtilities::VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>::
  ~VulkanObjectWrapper((CommandPoolWrapper *)local_98);
  local_98._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_98._0_8_ = (pointer)0x28;
  local_98._16_8_ = CmdPool->m_VkObject;
  local_98._24_8_ = 0x100000000;
  pVVar7 = VulkanUtilities::VulkanLogicalDevice::AllocateVkCommandBuffer
                     ((this->m_LogicalVkDevice).
                      super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,(VkCommandBufferAllocateInfo *)local_98,"");
  if (pVVar7 == (VkCommandBuffer)0x0) {
    FormatString<char[41]>
              ((string *)&local_78,(char (*) [41])"Failed to allocate Vulkan command buffer");
    DebugAssertionFailed
              (local_78._M_p,"AllocateTransientCmdPool",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderDeviceVkImpl.cpp"
               ,0x10f);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_p != &local_68) {
      operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
    }
  }
  pvStack_70 = (void *)0x0;
  local_68._M_local_buf[8] = '\0';
  local_68._M_local_buf[9] = '\0';
  local_68._M_local_buf[10] = '\0';
  local_68._M_local_buf[0xb] = '\0';
  local_68._M_local_buf[0xc] = '\0';
  local_68._M_local_buf[0xd] = '\0';
  local_68._M_local_buf[0xe] = '\0';
  local_68._M_local_buf[0xf] = '\0';
  local_78._M_p = (pointer)0x2a;
  local_68._M_allocated_capacity = 1;
  VVar4 = (*vkBeginCommandBuffer)(pVVar7,(VkCommandBufferBeginInfo *)&local_78);
  if (VVar4 != VK_SUCCESS) {
    FormatString<char[30]>(&local_50,(char (*) [30])"vkBeginCommandBuffer() failed");
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"AllocateTransientCmdPool",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderDeviceVkImpl.cpp"
               ,0x11b);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  peVar3 = (this->m_LogicalVkDevice).
           super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  VVar1 = (peVar3->m_SupportedStagesMask).
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[local_99.m_Value];
  VVar2 = (peVar3->m_SupportedAccessMask).
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[local_99.m_Value];
  CmdBuffer->m_VkCmdBuffer = pVVar7;
  (CmdBuffer->m_Barrier).SupportedStagesMask = VVar1;
  (CmdBuffer->m_Barrier).SupportedAccessMask = VVar2;
  return;
}

Assistant:

void RenderDeviceVkImpl::AllocateTransientCmdPool(SoftwareQueueIndex                    CommandQueueId,
                                                  VulkanUtilities::CommandPoolWrapper&  CmdPool,
                                                  VulkanUtilities::VulkanCommandBuffer& CmdBuffer,
                                                  const Char*                           DebugPoolName)
{
    HardwareQueueIndex QueueFamilyIndex{GetCommandQueue(CommandQueueId).GetQueueFamilyIndex()};
    auto               CmdPoolMgrIter = m_TransientCmdPoolMgrs.find(QueueFamilyIndex);
    VERIFY(CmdPoolMgrIter != m_TransientCmdPoolMgrs.end(),
           "Con not find transient command pool manager for queue family index (", Uint32{QueueFamilyIndex}, ")");

    CmdPool = CmdPoolMgrIter->second.AllocateCommandPool(DebugPoolName);

    // Allocate command buffer from the cmd pool
    VkCommandBufferAllocateInfo BuffAllocInfo{};
    BuffAllocInfo.sType              = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
    BuffAllocInfo.pNext              = nullptr;
    BuffAllocInfo.commandPool        = CmdPool;
    BuffAllocInfo.level              = VK_COMMAND_BUFFER_LEVEL_PRIMARY;
    BuffAllocInfo.commandBufferCount = 1;

    VkCommandBuffer vkCmdBuff = m_LogicalVkDevice->AllocateVkCommandBuffer(BuffAllocInfo);
    DEV_CHECK_ERR(vkCmdBuff != VK_NULL_HANDLE, "Failed to allocate Vulkan command buffer");


    VkCommandBufferBeginInfo CmdBuffBeginInfo{};
    CmdBuffBeginInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
    CmdBuffBeginInfo.pNext = nullptr;
    CmdBuffBeginInfo.flags = VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT; // Each recording of the command buffer will only be
                                                                          // submitted once, and the command buffer will be reset
                                                                          // and recorded again between each submission.
    CmdBuffBeginInfo.pInheritanceInfo = nullptr;                          // Ignored for a primary command buffer

    VkResult err = vkBeginCommandBuffer(vkCmdBuff, &CmdBuffBeginInfo);
    DEV_CHECK_ERR(err == VK_SUCCESS, "vkBeginCommandBuffer() failed");
    (void)err;

    CmdBuffer.SetVkCmdBuffer(vkCmdBuff,
                             m_LogicalVkDevice->GetSupportedStagesMask(QueueFamilyIndex),
                             m_LogicalVkDevice->GetSupportedAccessMask(QueueFamilyIndex));
}